

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O3

timestamp_t duckdb::Interval::Add(timestamp_t left,interval_t right)

{
  date_t date_00;
  int iVar1;
  timestamp_t tVar2;
  int64_t in_RCX;
  long lVar3;
  interval_t right_00;
  date_t date;
  dtime_t time;
  date_t local_34;
  dtime_t local_30;
  
  right_00._0_8_ = right.micros;
  if ((left.value == -0x7fffffffffffffff) || (left.value == 0x7fffffffffffffff)) {
    return (timestamp_t)left.value;
  }
  Timestamp::Convert(left,&local_34,&local_30);
  right_00.micros = in_RCX;
  date_00 = Add((Interval *)(ulong)(uint)local_34.days,right.months,right_00);
  local_30.micros = right_00._0_8_ % 86400000000 + local_30.micros;
  if (local_30.micros < 86400000000) {
    if (-1 < local_30.micros) goto LAB_002d2b89;
    lVar3 = 86400000000;
    iVar1 = -1;
  }
  else {
    iVar1 = 1;
    lVar3 = -86400000000;
  }
  local_30.micros = local_30.micros + lVar3;
  date_00.days = date_00.days + iVar1;
LAB_002d2b89:
  tVar2 = Timestamp::FromDatetime(date_00,local_30);
  return (timestamp_t)tVar2.value;
}

Assistant:

timestamp_t Interval::Add(timestamp_t left, interval_t right) {
	if (!Timestamp::IsFinite(left)) {
		return left;
	}
	date_t date;
	dtime_t time;
	Timestamp::Convert(left, date, time);
	auto new_date = Interval::Add(date, right);
	auto new_time = Interval::Add(time, right, new_date);
	return Timestamp::FromDatetime(new_date, new_time);
}